

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffphbn(fitsfile *fptr,LONGLONG naxis2,int tfields,char **ttype,char **tform,char **tunit,
          char *extnmx,LONGLONG pcount,int *status)

{
  int iVar1;
  size_t sVar2;
  tcolumn *colptr;
  char card [81];
  char *cptr;
  char extnm [71];
  char local_128 [8];
  char comm [73];
  char name [75];
  char tfmt [30];
  LONGLONG naxis1;
  long width;
  long repeat;
  int local_48;
  int iread;
  int datatype;
  int ii;
  char **tunit_local;
  char **tform_local;
  char **ttype_local;
  LONGLONG LStack_20;
  int tfields_local;
  LONGLONG naxis2_local;
  fitsfile *fptr_local;
  
  repeat._4_4_ = 0;
  if (*status < 1) {
    _datatype = tunit;
    tunit_local = tform;
    tform_local = ttype;
    ttype_local._4_4_ = tfields;
    LStack_20 = naxis2;
    naxis2_local = (LONGLONG)fptr;
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (*(long *)(*(long *)(naxis2_local + 8) + 0x70) ==
        *(long *)(*(long *)(*(long *)(naxis2_local + 8) + 0x68) +
                 (long)*(int *)(*(long *)(naxis2_local + 8) + 0x54) * 8)) {
      if (LStack_20 < 0) {
        *status = 0xda;
        fptr_local._4_4_ = 0xda;
      }
      else if (pcount < 0) {
        *status = 0xd6;
        fptr_local._4_4_ = 0xd6;
      }
      else if ((ttype_local._4_4_ < 0) || (999 < ttype_local._4_4_)) {
        *status = 0xd8;
        fptr_local._4_4_ = 0xd8;
      }
      else {
        cptr._0_1_ = '\0';
        if (extnmx != (char *)0x0) {
          strncat((char *)&cptr,extnmx,0x46);
        }
        ffpkys((fitsfile *)naxis2_local,"XTENSION","BINTABLE","binary table extension",status);
        ffpkyj((fitsfile *)naxis2_local,"BITPIX",8,"8-bit bytes",status);
        ffpkyj((fitsfile *)naxis2_local,"NAXIS",2,"2-dimensional binary table",status);
        stack0xffffffffffffff98 = 0;
        for (iread = 0; iread < ttype_local._4_4_; iread = iread + 1) {
          ffbnfm(tunit_local[iread],&local_48,&width,&naxis1,status);
          if (local_48 == 0x10) {
            register0x00000000 = width + stack0xffffffffffffff98;
          }
          else if (local_48 == 1) {
            register0x00000000 = (width + 7) / 8 + stack0xffffffffffffff98;
          }
          else if (local_48 < 1) {
            if ((((*tunit_local[iread] == 'P') || (tunit_local[iread][1] == 'P')) ||
                (*tunit_local[iread] == 'p')) || (tunit_local[iread][1] == 'p')) {
              register0x00000000 = stack0xffffffffffffff98 + 8;
            }
            else {
              register0x00000000 = stack0xffffffffffffff98 + 0x10;
            }
          }
          else {
            register0x00000000 = width * (local_48 / 10) + stack0xffffffffffffff98;
          }
          if (0 < *status) break;
        }
        ffpkyj((fitsfile *)naxis2_local,"NAXIS1",stack0xffffffffffffff98,"width of table in bytes",
               status);
        ffpkyj((fitsfile *)naxis2_local,"NAXIS2",LStack_20,"number of rows in table",status);
        ffpkyj((fitsfile *)naxis2_local,"PCOUNT",0,"size of special data area",status);
        ffpkyj((fitsfile *)naxis2_local,"GCOUNT",1,"one data group (required keyword)",status);
        ffpkyj((fitsfile *)naxis2_local,"TFIELDS",(long)ttype_local._4_4_,
               "number of fields in each row",status);
        for (iread = 0; iread < ttype_local._4_4_; iread = iread + 1) {
          if (*tform_local[iread] != '\0') {
            snprintf(local_128,0x49,"label for field %3d",(ulong)(iread + 1));
            ffkeyn("TTYPE",iread + 1,comm + 0x48,status);
            ffpkys((fitsfile *)naxis2_local,comm + 0x48,tform_local[iread],local_128,status);
          }
          sVar2 = strlen(tunit_local[iread]);
          if (0x1d < sVar2) {
            ffpmsg("Error: BIN table TFORM code is too long (ffphbn)");
            *status = 0x105;
            break;
          }
          strcpy(name + 0x48,tunit_local[iread]);
          ffupch(name + 0x48);
          ffkeyn("TFORM",iread + 1,comm + 0x48,status);
          strcpy(local_128,"data format of field");
          ffbnfm(name + 0x48,&local_48,&width,&naxis1,status);
          if (local_48 == 0x10) {
            strcat(local_128,": ASCII Character");
            register0x00000000 = strchr(name + 0x48,0x41);
            register0x00000000 = register0x00000000 + 1;
            if (register0x00000000 != (char *)0x0) {
              repeat._4_4_ = __isoc99_sscanf(register0x00000000,"%ld",&naxis1);
            }
            if ((repeat._4_4_ == 1) && (width < naxis1)) {
              if (width == 1) {
                strcpy(local_128,"ERROR??  USING ASCII TABLE SYNTAX BY MISTAKE??");
              }
              else {
                strcpy(local_128,"rAw FORMAT ERROR! UNIT WIDTH w > COLUMN WIDTH r");
              }
            }
          }
          else if (local_48 == 1) {
            strcat(local_128,": BIT");
          }
          else if (local_48 == 0xb) {
            strcat(local_128,": BYTE");
          }
          else if (local_48 == 0xe) {
            strcat(local_128,": 1-byte LOGICAL");
          }
          else if (local_48 == 0x15) {
            strcat(local_128,": 2-byte INTEGER");
          }
          else if (local_48 == 0x14) {
            strcat(local_128,": 2-byte INTEGER");
          }
          else if (local_48 == 0x29) {
            strcat(local_128,": 4-byte INTEGER");
          }
          else if (local_48 == 0x51) {
            strcat(local_128,": 8-byte INTEGER");
          }
          else if (local_48 == 0x28) {
            strcat(local_128,": 4-byte INTEGER");
          }
          else if (local_48 == 0x50) {
            strcat(local_128,": 8-byte INTEGER");
          }
          else if (local_48 == 0x2a) {
            strcat(local_128,": 4-byte REAL");
          }
          else if (local_48 == 0x52) {
            strcat(local_128,": 8-byte DOUBLE");
          }
          else if (local_48 == 0x53) {
            strcat(local_128,": COMPLEX");
          }
          else if (local_48 == 0xa3) {
            strcat(local_128,": DOUBLE COMPLEX");
          }
          else if (local_48 < 0) {
            strcat(local_128,": variable length array");
          }
          iVar1 = local_48;
          if (local_48 < 1) {
            iVar1 = -local_48;
          }
          if (iVar1 == 0xc) {
            for (unique0x00004780 = name + 0x48; *stack0xfffffffffffffe80 != 'S';
                register0x00000000 = stack0xfffffffffffffe80 + 1) {
            }
            *stack0xfffffffffffffe80 = 'B';
            ffpkys((fitsfile *)naxis2_local,comm + 0x48,name + 0x48,local_128,status);
            ffkeyn("TZERO",iread + 1,comm + 0x48,status);
            strcpy(local_128,"offset for signed bytes");
            ffpkyg((fitsfile *)naxis2_local,comm + 0x48,-128.0,0,local_128,status);
            ffkeyn("TSCAL",iread + 1,comm + 0x48,status);
            strcpy(local_128,"data are not scaled");
            ffpkyg((fitsfile *)naxis2_local,comm + 0x48,1.0,0,local_128,status);
          }
          else {
            iVar1 = local_48;
            if (local_48 < 1) {
              iVar1 = -local_48;
            }
            if (iVar1 == 0x14) {
              for (unique0x00004780 = name + 0x48; *stack0xfffffffffffffe80 != 'U';
                  register0x00000000 = stack0xfffffffffffffe80 + 1) {
              }
              *stack0xfffffffffffffe80 = 'I';
              ffpkys((fitsfile *)naxis2_local,comm + 0x48,name + 0x48,local_128,status);
              ffkeyn("TZERO",iread + 1,comm + 0x48,status);
              strcpy(local_128,"offset for unsigned integers");
              ffpkyg((fitsfile *)naxis2_local,comm + 0x48,32768.0,0,local_128,status);
              ffkeyn("TSCAL",iread + 1,comm + 0x48,status);
              strcpy(local_128,"data are not scaled");
              ffpkyg((fitsfile *)naxis2_local,comm + 0x48,1.0,0,local_128,status);
            }
            else {
              iVar1 = local_48;
              if (local_48 < 1) {
                iVar1 = -local_48;
              }
              if (iVar1 == 0x28) {
                for (unique0x00004780 = name + 0x48; *stack0xfffffffffffffe80 != 'V';
                    register0x00000000 = stack0xfffffffffffffe80 + 1) {
                }
                *stack0xfffffffffffffe80 = 'J';
                ffpkys((fitsfile *)naxis2_local,comm + 0x48,name + 0x48,local_128,status);
                ffkeyn("TZERO",iread + 1,comm + 0x48,status);
                strcpy(local_128,"offset for unsigned integers");
                ffpkyg((fitsfile *)naxis2_local,comm + 0x48,2147483648.0,0,local_128,status);
                ffkeyn("TSCAL",iread + 1,comm + 0x48,status);
                strcpy(local_128,"data are not scaled");
                ffpkyg((fitsfile *)naxis2_local,comm + 0x48,1.0,0,local_128,status);
              }
              else {
                iVar1 = local_48;
                if (local_48 < 1) {
                  iVar1 = -local_48;
                }
                if (iVar1 == 0x50) {
                  for (unique0x00004780 = name + 0x48; *stack0xfffffffffffffe80 != 'W';
                      register0x00000000 = stack0xfffffffffffffe80 + 1) {
                  }
                  *stack0xfffffffffffffe80 = 'K';
                  ffpkys((fitsfile *)naxis2_local,comm + 0x48,name + 0x48,local_128,status);
                  ffkeyn("TZERO",iread + 1,(char *)&colptr,status);
                  strcat((char *)&colptr,"     ");
                  card[0] = '\0';
                  strcat((char *)&colptr,"=  9223372036854775808 / offset for unsigned integers");
                  ffprec((fitsfile *)naxis2_local,(char *)&colptr,status);
                  ffkeyn("TSCAL",iread + 1,comm + 0x48,status);
                  strcpy(local_128,"data are not scaled");
                  ffpkyg((fitsfile *)naxis2_local,comm + 0x48,1.0,0,local_128,status);
                }
                else {
                  ffpkys((fitsfile *)naxis2_local,comm + 0x48,name + 0x48,local_128,status);
                }
              }
            }
          }
          if (((_datatype != (char **)0x0) && (_datatype[iread] != (char *)0x0)) &&
             (*_datatype[iread] != '\0')) {
            ffkeyn("TUNIT",iread + 1,comm + 0x48,status);
            ffpkys((fitsfile *)naxis2_local,comm + 0x48,_datatype[iread],"physical unit of field",
                   status);
          }
          if (0 < *status) break;
        }
        if ((char)cptr != '\0') {
          ffpkys((fitsfile *)naxis2_local,"EXTNAME",(char *)&cptr,
                 "name of this binary table extension",status);
        }
        if (0 < *status) {
          ffpmsg("Failed to write binary table header keywords (ffphbn)");
        }
        fptr_local._4_4_ = *status;
      }
    }
    else {
      *status = 0xc9;
      fptr_local._4_4_ = 0xc9;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffphbn(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,   /* I - value of EXTNAME keyword, if any         */
           LONGLONG pcount,     /* I - size of the variable length heap area    */
           int *status)     /* IO - error status                            */
/*
  Put required Header keywords into the Binary Table:
*/
{
    int ii, datatype, iread = 0;
    long repeat, width;
    LONGLONG naxis1;

    char tfmt[30], name[FLEN_KEYWORD], comm[FLEN_COMMENT], extnm[FLEN_VALUE];
    char *cptr, card[FLEN_CARD];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);
    else if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (pcount < 0)
        return(*status = BAD_PCOUNT);
    else if (tfields < 0 || tfields > 999)
        return(*status = BAD_TFIELDS);

    extnm[0] = '\0';
    if (extnmx)
        strncat(extnm, extnmx, FLEN_VALUE-1);

    ffpkys(fptr, "XTENSION", "BINTABLE", "binary table extension", status);
    ffpkyj(fptr, "BITPIX", 8, "8-bit bytes", status);
    ffpkyj(fptr, "NAXIS", 2, "2-dimensional binary table", status);

    naxis1 = 0;
    for (ii = 0; ii < tfields; ii++)  /* sum the width of each field */
    {
        ffbnfm(tform[ii], &datatype, &repeat, &width, status);

        if (datatype == TSTRING)
            naxis1 += repeat;   /* one byte per char */
        else if (datatype == TBIT)
            naxis1 += (repeat + 7) / 8;
        else if (datatype > 0)
            naxis1 += repeat * (datatype / 10);
        else if (tform[ii][0] == 'P' || tform[ii][1] == 'P'||
                 tform[ii][0] == 'p' || tform[ii][1] == 'p')
           /* this is a 'P' variable length descriptor (neg. datatype) */
            naxis1 += 8;
        else
           /* this is a 'Q' variable length descriptor (neg. datatype) */
            naxis1 += 16;

        if (*status > 0)
            break;       /* abort loop on error */
    }

    ffpkyj(fptr, "NAXIS1", naxis1, "width of table in bytes", status);
    ffpkyj(fptr, "NAXIS2", naxis2, "number of rows in table", status);

    /*
      the initial value of PCOUNT (= size of the variable length array heap)
      should always be zero.  If any variable length data is written, then
      the value of PCOUNT will be updated when the HDU is closed
    */
    ffpkyj(fptr, "PCOUNT", 0, "size of special data area", status);
    ffpkyj(fptr, "GCOUNT", 1, "one data group (required keyword)", status);
    ffpkyj(fptr, "TFIELDS", tfields, "number of fields in each row", status);

    for (ii = 0; ii < tfields; ii++) /* loop over every column */
    {
        if ( *(ttype[ii]) )  /* optional TTYPEn keyword */
        {
          snprintf(comm, FLEN_COMMENT,"label for field %3d", ii + 1);
          ffkeyn("TTYPE", ii + 1, name, status);
          ffpkys(fptr, name, ttype[ii], comm, status);
        }

        if (strlen(tform[ii]) > 29)
        {
          ffpmsg("Error: BIN table TFORM code is too long (ffphbn)");
          *status = BAD_TFORM;
          break;
        }
        strcpy(tfmt, tform[ii]);  /* required TFORMn keyword */
        ffupch(tfmt);

        ffkeyn("TFORM", ii + 1, name, status);
        strcpy(comm, "data format of field");

        ffbnfm(tfmt, &datatype, &repeat, &width, status);

        if (datatype == TSTRING)
        {
            strcat(comm, ": ASCII Character");

            /* Do sanity check to see if an ASCII table format was used,  */
            /* e.g., 'A8' instead of '8A', or a bad unit width eg '8A9'.  */
            /* Don't want to return an error status, so write error into  */
            /* the keyword comment.  */

            cptr = strchr(tfmt,'A');
            cptr++;

            if (cptr)
               iread = sscanf(cptr,"%ld", &width);

            if (iread == 1 && (width > repeat)) 
            {
              if (repeat == 1)
                strcpy(comm, "ERROR??  USING ASCII TABLE SYNTAX BY MISTAKE??");
              else
                strcpy(comm, "rAw FORMAT ERROR! UNIT WIDTH w > COLUMN WIDTH r");
            }
        }
        else if (datatype == TBIT)
           strcat(comm, ": BIT");
        else if (datatype == TBYTE)
           strcat(comm, ": BYTE");
        else if (datatype == TLOGICAL)
           strcat(comm, ": 1-byte LOGICAL");
        else if (datatype == TSHORT)
           strcat(comm, ": 2-byte INTEGER");
        else if (datatype == TUSHORT)
           strcat(comm, ": 2-byte INTEGER");
        else if (datatype == TLONG)
           strcat(comm, ": 4-byte INTEGER");
        else if (datatype == TLONGLONG)
           strcat(comm, ": 8-byte INTEGER");
        else if (datatype == TULONG)
           strcat(comm, ": 4-byte INTEGER");
        else if (datatype == TULONGLONG)
           strcat(comm, ": 8-byte INTEGER");
        else if (datatype == TFLOAT)
           strcat(comm, ": 4-byte REAL");
        else if (datatype == TDOUBLE)
           strcat(comm, ": 8-byte DOUBLE");
        else if (datatype == TCOMPLEX)
           strcat(comm, ": COMPLEX");
        else if (datatype == TDBLCOMPLEX)
           strcat(comm, ": DOUBLE COMPLEX");
        else if (datatype < 0)
           strcat(comm, ": variable length array");

        if (abs(datatype) == TSBYTE) /* signed bytes */
        {
           /* Replace the 'S' with an 'B' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'S') 
              cptr++;

           *cptr = 'B';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for signed bytes");

           ffpkyg(fptr, name, -128., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TUSHORT) 
        {
           /* Replace the 'U' with an 'I' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'U') 
              cptr++;

           *cptr = 'I';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, name, 32768., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TULONG) 
        {
           /* Replace the 'V' with an 'J' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'V') 
              cptr++;

           *cptr = 'J';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, name, 2147483648., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TULONGLONG) 
        {	   
           /* Replace the 'W' with an 'K' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'W') 
              cptr++;

           *cptr = 'K';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, card, status);
           strcat(card, "     ");  /* make sure name is >= 8 chars long */
           *(card+8) = '\0';
	   strcat(card, "=  9223372036854775808 / offset for unsigned integers");
	   fits_write_record(fptr, card, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else
        {
           ffpkys(fptr, name, tfmt, comm, status);
        }

        if (tunit)
        {
         if (tunit[ii] && *(tunit[ii]) ) /* optional TUNITn keyword */
         {
          ffkeyn("TUNIT", ii + 1, name, status);
          ffpkys(fptr, name, tunit[ii],
             "physical unit of field", status);
         }
        }

        if (*status > 0)
            break;       /* abort loop on error */
    }

    if (extnm[0])       /* optional EXTNAME keyword */
        ffpkys(fptr, "EXTNAME", extnm,
               "name of this binary table extension", status);

    if (*status > 0)
        ffpmsg("Failed to write binary table header keywords (ffphbn)");

    return(*status);
}